

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase339::run(TestCase339 *this)

{
  bool bVar1;
  char *in_RCX;
  bool errors;
  char (*in_RDX) [4];
  char (*extraout_RDX) [8];
  char (*extraout_RDX_00) [8];
  char (*text) [8];
  char (*extraout_RDX_01) [3];
  char (*extraout_RDX_02) [3];
  char (*text_00) [3];
  bool errors_00;
  bool errors_01;
  char (*extraout_RDX_03) [11];
  char (*extraout_RDX_04) [11];
  char (*text_01) [11];
  char (*extraout_RDX_05) [10];
  char (*extraout_RDX_06) [10];
  char (*text_02) [10];
  char (*text_03) [8];
  char (*text_04) [7];
  char (*text_05) [9];
  char (*text_06) [6];
  char (*text_07) [8];
  char (*text_08) [5];
  kj *pkVar2;
  char *expected;
  kj *this_00;
  DecodeUriOptions in_R8W;
  ArrayPtr<const_unsigned_char> bytes_00;
  ArrayPtr<const_unsigned_char> bytes_01;
  ArrayPtr<const_char> text_09;
  byte bytes [3];
  EncodingResult<kj::Array<unsigned_char>_> local_128;
  Array<char> local_108;
  EncodingResult<kj::String> local_f0;
  EncodingResult<kj::String> local_d0;
  EncodingResult<kj::String> local_b0;
  EncodingResult<kj::String> local_90;
  EncodingResult<kj::String> local_70;
  EncodingResult<kj::String> local_50;
  EncodingResult<kj::String> local_30;
  
  encodeWwwForm<4ul>((String *)&local_128,(kj *)0x357ec7,in_RDX);
  local_108.ptr = "foo";
  local_108.size_ = 4;
  bVar1 = String::operator==((String *)&local_128,(StringPtr *)&local_108);
  Array<char>::~Array((Array<char> *)&local_128);
  text = extraout_RDX;
  if (!bVar1 && _::Debug::minSeverity < 3) {
    in_RCX = "\"failed: expected \" \"encodeWwwForm(\\\"foo\\\") == \\\"foo\\\"\"";
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x154,ERROR,"\"failed: expected \" \"encodeWwwForm(\\\"foo\\\") == \\\"foo\\\"\"",
               (char (*) [47])"failed: expected encodeWwwForm(\"foo\") == \"foo\"");
    text = extraout_RDX_00;
  }
  encodeWwwForm<8ul>((String *)&local_128,(kj *)0x355778,text);
  local_108.ptr = "foo+bar";
  local_108.size_ = 8;
  bVar1 = String::operator==((String *)&local_128,(StringPtr *)&local_108);
  Array<char>::~Array((Array<char> *)&local_128);
  text_00 = extraout_RDX_01;
  if (!bVar1 && _::Debug::minSeverity < 3) {
    in_RCX = "\"failed: expected \" \"encodeWwwForm(\\\"foo bar\\\") == \\\"foo+bar\\\"\"";
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x155,ERROR,
               "\"failed: expected \" \"encodeWwwForm(\\\"foo bar\\\") == \\\"foo+bar\\\"\"",
               (char (*) [55])"failed: expected encodeWwwForm(\"foo bar\") == \"foo+bar\"");
    text_00 = extraout_RDX_02;
  }
  encodeWwwForm<3ul>((String *)&local_128,(kj *)anon_var_dwarf_11f36d,text_00);
  local_108.ptr = "%AB%BA";
  local_108.size_ = 7;
  bVar1 = String::operator==((String *)&local_128,(StringPtr *)&local_108);
  Array<char>::~Array((Array<char> *)&local_128);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    in_RCX = "\"failed: expected \" \"encodeWwwForm(\\\"\\\\xab\\\\xba\\\") == \\\"%AB%BA\\\"\"";
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x156,ERROR,
               "\"failed: expected \" \"encodeWwwForm(\\\"\\\\xab\\\\xba\\\") == \\\"%AB%BA\\\"\"",
               (char (*) [55])"failed: expected encodeWwwForm(\"\\xab\\xba\") == \"%AB%BA\"");
  }
  bytes_00.size_ = (size_t)in_RCX;
  bytes_00.ptr = &DAT_00000007;
  encodeWwwForm((String *)&local_128,(kj *)"foo",bytes_00);
  local_108.ptr = "foo%00bar";
  local_108.size_ = 10;
  bVar1 = String::operator==((String *)&local_128,(StringPtr *)&local_108);
  Array<char>::~Array((Array<char> *)&local_128);
  text_01 = extraout_RDX_03;
  if (!bVar1 && _::Debug::minSeverity < 3) {
    in_RCX = 
    "\"failed: expected \" \"encodeWwwForm(StringPtr(\\\"foo\\\\0bar\\\", 7)) == \\\"foo%00bar\\\"\""
    ;
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[72]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x157,ERROR,
               "\"failed: expected \" \"encodeWwwForm(StringPtr(\\\"foo\\\\0bar\\\", 7)) == \\\"foo%00bar\\\"\""
               ,(char (*) [72])
                "failed: expected encodeWwwForm(StringPtr(\"foo\\0bar\", 7)) == \"foo%00bar\"");
    text_01 = extraout_RDX_04;
  }
  encodeWwwForm<11ul>((String *)&local_128,(kj *)"\'foo\'! (~)",text_01);
  local_108.ptr = "%27foo%27%21+%28%7E%29";
  local_108.size_ = 0x17;
  bVar1 = String::operator==((String *)&local_128,(StringPtr *)&local_108);
  Array<char>::~Array((Array<char> *)&local_128);
  text_02 = extraout_RDX_05;
  if (!bVar1 && _::Debug::minSeverity < 3) {
    in_RCX = 
    "\"failed: expected \" \"encodeWwwForm(\\\"\'foo\'! (~)\\\") == \\\"%27foo%27%21+%28%7E%29\\\"\""
    ;
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[73]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x15a,ERROR,
               "\"failed: expected \" \"encodeWwwForm(\\\"\'foo\'! (~)\\\") == \\\"%27foo%27%21+%28%7E%29\\\"\""
               ,(char (*) [73])
                "failed: expected encodeWwwForm(\"\'foo\'! (~)\") == \"%27foo%27%21+%28%7E%29\"");
    text_02 = extraout_RDX_06;
  }
  decodeWwwForm<10ul>(&local_30,(kj *)"foo%20bar",text_02);
  (anonymous_namespace)::expectRes<kj::String,char,8ul>(&local_30,(char (*) [8])0x355778,false);
  Array<char>::~Array((Array<char> *)&local_30);
  decodeWwwForm<8ul>(&local_50,(kj *)"foo+bar",text_03);
  (anonymous_namespace)::expectRes<kj::String,char,8ul>(&local_50,(char (*) [8])0x355778,false);
  Array<char>::~Array((Array<char> *)&local_50);
  expected = "%ab%BA";
  decodeWwwForm<7ul>(&local_70,(kj *)"%ab%BA",text_04);
  (anonymous_namespace)::expectRes<kj::String,char,3ul>(&local_70,(char (*) [3])expected,errors);
  Array<char>::~Array((Array<char> *)&local_70);
  decodeWwwForm<9ul>(&local_90,(kj *)"foo%1xxx",text_05);
  (anonymous_namespace)::expectRes<kj::String,char,8ul>(&local_90,(char (*) [8])"foo\x01xxx",true);
  Array<char>::~Array((Array<char> *)&local_90);
  decodeWwwForm<6ul>(&local_b0,(kj *)"foo%1",text_06);
  (anonymous_namespace)::expectRes<kj::String,char,5ul>(&local_b0,(char (*) [5])"foo\x01",true);
  Array<char>::~Array((Array<char> *)&local_b0);
  decodeWwwForm<8ul>(&local_d0,(kj *)"foo%xxx",text_07);
  (anonymous_namespace)::expectRes<kj::String,char,7ul>(&local_d0,(char (*) [7])"fooxxx",errors_00);
  Array<char>::~Array((Array<char> *)&local_d0);
  decodeWwwForm<5ul>(&local_f0,(kj *)"foo%",text_08);
  (anonymous_namespace)::expectRes<kj::String,char,4ul>(&local_f0,(char (*) [4])0x1,errors_01);
  Array<char>::~Array((Array<char> *)&local_f0);
  bytes[2] = '8';
  bytes[0] = '\f';
  bytes[1] = '\"';
  bytes_01.size_ = (size_t)in_RCX;
  bytes_01.ptr = (uchar *)0x3;
  encodeWwwForm((String *)&local_108,(kj *)bytes,bytes_01);
  this_00 = (kj *)local_108.size_;
  if ((kj *)local_108.size_ != (kj *)0x0) {
    this_00 = (kj *)local_108.ptr;
  }
  pkVar2 = (kj *)0x0;
  if ((kj *)local_108.size_ != (kj *)0x0) {
    pkVar2 = (kj *)(local_108.size_ + -1);
  }
  text_09.size_ = 0x100;
  text_09.ptr = (char *)pkVar2;
  decodeBinaryUriComponent(&local_128,this_00,text_09,in_R8W);
  bVar1 = Array<unsigned_char>::operator==(&local_128.super_Array<unsigned_char>,&bytes);
  Array<unsigned_char>::~Array(&local_128.super_Array<unsigned_char>);
  Array<char>::~Array(&local_108);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[82]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x168,ERROR,
               "\"failed: expected \" \"decodeBinaryUriComponent(encodeWwwForm(bytes), options) == bytes\""
               ,(char (*) [82])
                "failed: expected decodeBinaryUriComponent(encodeWwwForm(bytes), options) == bytes")
    ;
  }
  return;
}

Assistant:

TEST(Async, SeparateFulfillerCanceled) {
  auto pair = newPromiseAndFulfiller<void>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.promise = nullptr;
  EXPECT_FALSE(pair.fulfiller->isWaiting());
}